

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O3

string * __thiscall
duckdb::FormatString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,MangledEntryName *mangled)

{
  pointer pcVar1;
  string *psVar2;
  string *psVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&mangled->name);
  psVar2 = (string *)__return_storage_ptr__->_M_string_length;
  if (psVar2 != (string *)0x0) {
    psVar3 = (string *)0x0;
    do {
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if (pcVar1[(long)&(psVar3->_M_dataplus)._M_p] == '\0') {
        pcVar1[(long)&(psVar3->_M_dataplus)._M_p] = '_';
        psVar2 = (string *)__return_storage_ptr__->_M_string_length;
      }
      psVar3 = (string *)((long)&(psVar3->_M_dataplus)._M_p + 1);
    } while (psVar3 < psVar2);
  }
  return psVar2;
}

Assistant:

static string FormatString(const MangledEntryName &mangled) {
	auto input = mangled.name;
	for (size_t i = 0; i < input.size(); i++) {
		if (input[i] == '\0') {
			input[i] = '_';
		}
	}
	return input;
}